

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O0

void __thiscall Kraken::KClient::~KClient(KClient *this)

{
  KClient *this_local;
  
  curl_easy_cleanup(this->curl_);
  std::__cxx11::string::~string((string *)&this->version_);
  std::__cxx11::string::~string((string *)&this->url_);
  std::__cxx11::string::~string((string *)&this->secret_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

KClient::~KClient() 
{
   curl_easy_cleanup(curl_);
}